

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O2

int process_tracelog(char *fname,void *userdata)

{
  FILE *pFVar1;
  uint32 uVar2;
  int iVar3;
  ALfloat AVar4;
  ALfloat AVar5;
  ALfloat AVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  uint32 uVar10;
  __off_t _Var11;
  __off_t total;
  __off_t _Var12;
  ALuint *pAVar13;
  ALuint *pAVar14;
  ALfloat *pAVar15;
  ALfloat *pAVar16;
  ALfloat *pAVar17;
  ALboolean *origvalues;
  ALboolean *values;
  ALint *pAVar18;
  ALint *pAVar19;
  ALint *pAVar20;
  uint64 uVar21;
  ALvoid *origdata;
  uint8 *puVar22;
  ALCcontext *pAVar23;
  void *pvVar24;
  ALdouble *origvalues_00;
  ALdouble *values_00;
  ALCint *pAVar25;
  ALCint *pAVar26;
  ALCvoid *origbuffer;
  ALdouble AVar27;
  ALCchar *pAVar28;
  ALCdevice *pAVar29;
  int *piVar30;
  char *pcVar31;
  ulong uVar32;
  ALboolean okay;
  char *pcVar33;
  ulong uVar34;
  bool bVar35;
  int local_26c;
  uint64 bloblen;
  CallerInfo callerinfo;
  
  io_failure = '\0';
  next_mapped_threadid = 0;
  trace_scope = 0;
  guserdata = userdata;
  logfd = open(fname,0);
  pFVar1 = _stderr;
  pcVar33 = GAppName;
  if (logfd == -1) {
    piVar30 = __errno_location();
    pcVar31 = strerror(*piVar30);
    fprintf(pFVar1,"%s: Failed to open OpenAL log file \'%s\': %s\n",pcVar33,fname,pcVar31);
    fflush(_stderr);
  }
  else {
    fflush(_stderr);
    uVar2 = readle32();
    if (uVar2 == 0x104e5a1) {
      uVar2 = readle32();
      if (uVar2 == 1) {
        local_26c = 1;
        _Var11 = lseek(logfd,0,1);
        total = lseek(logfd,0,2);
        _Var12 = lseek(logfd,_Var11,0);
        pFVar1 = _stderr;
        pcVar33 = GAppName;
        if (((_Var12 == -1) || (_Var11 == -1)) || (total == -1)) {
          piVar30 = __errno_location();
          pcVar31 = strerror(*piVar30);
          fprintf(pFVar1,"%s: Failed to seek in file: %s\n",pcVar33,pcVar31);
          io_failure = '\x01';
        }
LAB_0010ca8f:
        bVar35 = true;
LAB_0010ca91:
        iVar3 = local_26c;
        if (!bVar35) {
LAB_0010f829:
          if (io_failure != '\x01') goto LAB_0010f842;
LAB_0010f832:
          visit_eos(guserdata,'\0',0);
LAB_0010f842:
          quit_altrace_playback();
          return iVar3;
        }
        iVar3 = 0;
        if (io_failure != '\0') goto LAB_0010f832;
        _Var11 = lseek(logfd,0,1);
        pFVar1 = _stderr;
        pcVar33 = GAppName;
        if (_Var11 == -1) {
          piVar30 = __errno_location();
          pcVar31 = strerror(*piVar30);
          iVar3 = 0;
          fprintf(pFVar1,"%s: Failed to get current file offset: %s\n",pcVar33,pcVar31);
          io_failure = '\x01';
          goto LAB_0010f832;
        }
        if (io_failure != '\0') goto LAB_0010f832;
        iVar3 = visit_progress(guserdata,_Var11,total);
        if (iVar3 == 0) {
          fprintf(_stderr,"%s: Application cancelled file processing!\n",GAppName);
          visit_eos(guserdata,'\0',0);
          iVar3 = -1;
          goto LAB_0010f829;
        }
        uVar2 = readle32();
        switch(uVar2) {
        case 0:
          uVar2 = readle32();
          bVar35 = false;
          if (io_failure != '\0') goto LAB_0010ca91;
          okay = '\x01';
          break;
        case 1:
          uVar2 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_al_error_event(guserdata,uVar2);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 2:
          pAVar29 = (ALCdevice *)readle64();
          uVar2 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_alc_error_event(guserdata,pAVar29,uVar2);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 3:
          uVar2 = readle32();
          goto LAB_0010e7a1;
        default:
          local_26c = 0;
          bVar35 = false;
          if (io_failure != '\0') goto LAB_0010ca91;
          local_26c = 0;
          okay = '\0';
          uVar2 = 0;
          break;
        case 5:
          pAVar29 = (ALCdevice *)readle64();
          uVar2 = readle32();
          uVar7 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_device_state_changed_int(guserdata,pAVar29,uVar2,uVar7);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 6:
          pAVar23 = (ALCcontext *)readle64();
          uVar2 = readle32();
          uVar7 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_context_state_changed_enum(guserdata,pAVar23,uVar2,uVar7);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 7:
          pAVar23 = (ALCcontext *)readle64();
          uVar2 = readle32();
          AVar4 = (ALfloat)readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_context_state_changed_float(guserdata,pAVar23,uVar2,AVar4);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 8:
          pAVar23 = (ALCcontext *)readle64();
          uVar2 = readle32();
          pcVar33 = IO_STRING();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_context_state_changed_string(guserdata,pAVar23,uVar2,pcVar33);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 9:
          pAVar23 = (ALCcontext *)readle64();
          uVar2 = readle32();
          uVar7 = readle32();
          pAVar15 = (ALfloat *)get_ioblob((ulong)uVar7 * 4);
          for (uVar34 = 0; uVar7 != uVar34; uVar34 = uVar34 + 1) {
            AVar4 = (ALfloat)readle32();
            pAVar15[uVar34] = AVar4;
          }
          bVar35 = true;
          if (io_failure == '\0') {
            visit_listener_state_changed_floatv(guserdata,pAVar23,uVar2,uVar7,pAVar15);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 10:
          uVar2 = readle32();
          uVar7 = readle32();
          uVar8 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_bool(guserdata,uVar2,uVar7,(ALboolean)uVar8);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0xb:
          uVar2 = readle32();
          uVar7 = readle32();
          uVar8 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_enum(guserdata,uVar2,uVar7,uVar8);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0xc:
          uVar2 = readle32();
          uVar7 = readle32();
          uVar8 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_int(guserdata,uVar2,uVar7,uVar8);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0xd:
          uVar2 = readle32();
          uVar7 = readle32();
          uVar8 = readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_uint(guserdata,uVar2,uVar7,uVar8);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0xe:
          uVar2 = readle32();
          uVar7 = readle32();
          AVar4 = (ALfloat)readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_float(guserdata,uVar2,uVar7,AVar4);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0xf:
          uVar2 = readle32();
          uVar7 = readle32();
          AVar4 = (ALfloat)readle32();
          AVar5 = (ALfloat)readle32();
          AVar6 = (ALfloat)readle32();
          bVar35 = true;
          if (io_failure == '\0') {
            visit_source_state_changed_float3(guserdata,uVar2,uVar7,AVar4,AVar5,AVar6);
            goto LAB_0010ca8f;
          }
          goto LAB_0010ca91;
        case 0x10:
          goto switchD_0010cb03_caseD_10;
        case 0x11:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pAVar23 = (ALCcontext *)readle64(), io_failure == '\0')) {
            visit_alcGetCurrentContext(&callerinfo,pAVar23);
          }
          goto LAB_0010ca8f;
        case 0x12:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar23 = (ALCcontext *)readle64();
            pAVar29 = (ALCdevice *)readle64();
            if (io_failure == '\0') {
              visit_alcGetContextsDevice(&callerinfo,pAVar29,pAVar23);
            }
          }
          goto LAB_0010ca8f;
        case 0x13:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            pcVar33 = IO_STRING();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcIsExtensionPresent(&callerinfo,(ALCboolean)uVar2,pAVar29,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x14:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            pcVar33 = IO_STRING();
            pvVar24 = (void *)readle64();
            if (io_failure == '\0') {
              visit_alcGetProcAddress(&callerinfo,pvVar24,pAVar29,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x15:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            pcVar33 = IO_STRING();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcGetEnumValue(&callerinfo,uVar2,pAVar29,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x16:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            uVar2 = readle32();
            pcVar33 = IO_STRING();
            if (io_failure == '\0') {
              visit_alcGetString(&callerinfo,pcVar33,pAVar29,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x17:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            uVar2 = readle32();
            uVar7 = readle32();
            uVar21 = readle64();
            pAVar29 = (ALCdevice *)readle64();
            if (pAVar29 == (ALCdevice *)0x0) {
              pcVar31 = (ALCchar *)0x0;
              uVar8 = 0;
              uVar10 = 0;
              pAVar28 = (ALCchar *)0x0;
            }
            else {
              uVar8 = readle32();
              uVar10 = readle32();
              pcVar31 = IO_STRING();
              pAVar28 = IO_STRING();
            }
            if (io_failure == '\0') {
              visit_alcCaptureOpenDevice
                        (&callerinfo,pAVar29,pcVar33,uVar2,uVar7,(ALCsizei)uVar21,uVar8,uVar10,
                         pcVar31,pAVar28);
            }
          }
          goto LAB_0010ca8f;
        case 0x18:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcCaptureCloseDevice(&callerinfo,(ALCboolean)uVar2,pAVar29);
            }
            goto LAB_0010d818;
          }
          goto LAB_0010ca8f;
        case 0x19:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            pAVar29 = (ALCdevice *)readle64();
            if (pAVar29 == (ALCdevice *)0x0) {
              pcVar31 = (ALCchar *)0x0;
              uVar2 = 0;
              uVar7 = 0;
              pAVar28 = (ALCchar *)0x0;
            }
            else {
              uVar2 = readle32();
              uVar7 = readle32();
              pcVar31 = IO_STRING();
              pAVar28 = IO_STRING();
            }
            if (io_failure == '\0') {
              visit_alcOpenDevice(&callerinfo,pAVar29,pcVar33,uVar2,uVar7,pcVar31,pAVar28);
            }
          }
          goto LAB_0010ca8f;
        case 0x1a:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcCloseDevice(&callerinfo,(ALCboolean)uVar2,pAVar29);
            }
LAB_0010d818:
            add_devicelabel_to_map(pAVar29,(char *)0x0);
          }
          goto LAB_0010ca8f;
        case 0x1b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            pAVar25 = (ALCint *)readle64();
            uVar2 = readle32();
            if (uVar2 == 0) {
              pAVar26 = (ALCint *)0x0;
            }
            else {
              pAVar26 = (ALCint *)get_ioblob((ulong)uVar2 * 4);
              for (uVar34 = 0; uVar2 != uVar34; uVar34 = uVar34 + 1) {
                uVar7 = readle32();
                pAVar26[uVar34] = uVar7;
              }
            }
            pAVar23 = (ALCcontext *)readle64();
            if (io_failure == '\0') {
              visit_alcCreateContext(&callerinfo,pAVar23,pAVar29,pAVar25,uVar2,pAVar26);
            }
          }
          goto LAB_0010ca8f;
        case 0x1c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar23 = (ALCcontext *)readle64();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcMakeContextCurrent(&callerinfo,(ALCboolean)uVar2,pAVar23);
            }
          }
          goto LAB_0010ca8f;
        case 0x1d:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pAVar23 = (ALCcontext *)readle64(), io_failure == '\0')) {
            visit_alcProcessContext(&callerinfo,pAVar23);
          }
          goto LAB_0010ca8f;
        case 0x1e:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pAVar23 = (ALCcontext *)readle64(), io_failure == '\0')) {
            visit_alcSuspendContext(&callerinfo,pAVar23);
          }
          goto LAB_0010ca8f;
        case 0x1f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar23 = (ALCcontext *)readle64();
            if (io_failure == '\0') {
              visit_alcDestroyContext(&callerinfo,pAVar23);
            }
            add_contextlabel_to_map(pAVar23,(char *)0x0);
          }
          goto LAB_0010ca8f;
        case 0x20:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alcGetError(&callerinfo,uVar2,pAVar29);
            }
          }
          goto LAB_0010ca8f;
        case 0x21:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            uVar2 = readle32();
            uVar21 = readle64();
            pAVar25 = (ALCint *)readle64();
            uVar34 = 0;
            iVar3 = (int)uVar21;
            if (pAVar25 == (ALCint *)0x0) {
              pAVar26 = (ALCint *)0x0;
            }
            else {
              pAVar26 = (ALCint *)get_ioblob((long)iVar3 << 2);
              uVar32 = 0;
              if (0 < iVar3) {
                uVar32 = uVar21 & 0xffffffff;
              }
              for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
                uVar7 = readle32();
                pAVar26[uVar34] = uVar7;
              }
            }
            if (io_failure == '\0') {
              visit_alcGetIntegerv(&callerinfo,pAVar29,uVar2,iVar3,pAVar25,uVar2 == 0x313,pAVar26);
            }
          }
          goto LAB_0010ca8f;
        case 0x22:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pAVar29 = (ALCdevice *)readle64(), io_failure == '\0')) {
            visit_alcCaptureStart(&callerinfo,pAVar29);
          }
          goto LAB_0010ca8f;
        case 0x23:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pAVar29 = (ALCdevice *)readle64(), io_failure == '\0')) {
            visit_alcCaptureStop(&callerinfo,pAVar29);
          }
          goto LAB_0010ca8f;
        case 0x24:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            origbuffer = (ALCvoid *)readle64();
            uVar21 = readle64();
            puVar22 = IO_BLOB(&bloblen);
            if (io_failure == '\0') {
              visit_alcCaptureSamples
                        (&callerinfo,pAVar29,origbuffer,puVar22,(ALsizei)bloblen,(ALCsizei)uVar21);
            }
          }
          goto LAB_0010ca8f;
        case 0x25:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (AVar4 = (ALfloat)readle32(), io_failure == '\0')) {
            visit_alDopplerFactor(&callerinfo,AVar4);
          }
          goto LAB_0010ca8f;
        case 0x26:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (AVar4 = (ALfloat)readle32(), io_failure == '\0')) {
            visit_alDopplerVelocity(&callerinfo,AVar4);
          }
          goto LAB_0010ca8f;
        case 0x27:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (AVar4 = (ALfloat)readle32(), io_failure == '\0')) {
            visit_alSpeedOfSound(&callerinfo,AVar4);
          }
          goto LAB_0010ca8f;
        case 0x28:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alDistanceModel(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x29:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alEnable(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x2a:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alDisable(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x2b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alIsEnabled(&callerinfo,(ALboolean)uVar7,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x2c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pcVar33 = IO_STRING();
            if (io_failure == '\0') {
              visit_alGetString(&callerinfo,pcVar33,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x2d:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            origvalues = (ALboolean *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              values = (ALboolean *)0x0;
            }
            else {
              values = (ALboolean *)get_ioblob(uVar34);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar8 = readle32();
              values[uVar32] = (ALboolean)uVar8;
            }
            if (io_failure == '\0') {
              visit_alGetBooleanv(&callerinfo,uVar2,origvalues,uVar7,values);
            }
          }
          goto LAB_0010ca8f;
        case 0x2e:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar19 = (ALint *)0x0;
            }
            else {
              pAVar19 = (ALint *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar8 = readle32();
              pAVar19[uVar32] = uVar8;
            }
            if (io_failure == '\0') {
              visit_alGetIntegerv(&callerinfo,uVar2,pAVar18,uVar7,uVar2 == 0xd000,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x2f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar16 = (ALfloat *)0x0;
            }
            else {
              pAVar16 = (ALfloat *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar32] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alGetFloatv(&callerinfo,uVar2,pAVar15,uVar7,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x30:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            origvalues_00 = (ALdouble *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              values_00 = (ALdouble *)0x0;
            }
            else {
              values_00 = (ALdouble *)get_ioblob(uVar34 * 8);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar27 = (ALdouble)readle64();
              values_00[uVar32] = AVar27;
            }
            if (io_failure == '\0') {
              visit_alGetDoublev(&callerinfo,uVar2,origvalues_00,uVar7,values_00);
            }
          }
          goto LAB_0010ca8f;
        case 0x31:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alGetBoolean(&callerinfo,(ALboolean)uVar7,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x32:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alGetInteger(&callerinfo,uVar7,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x33:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetFloat(&callerinfo,AVar4,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x34:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            AVar27 = (ALdouble)readle64();
            if (io_failure == '\0') {
              visit_alGetDouble(&callerinfo,AVar27,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x35:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alIsExtensionPresent(&callerinfo,(ALboolean)uVar2,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x36:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alGetError(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x37:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            pvVar24 = (void *)readle64();
            if (io_failure == '\0') {
              visit_alGetProcAddress(&callerinfo,pvVar24,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x38:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            uVar2 = readle32();
            if (io_failure == '\0') {
              visit_alGetEnumValue(&callerinfo,uVar2,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x39:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar16 = (ALfloat *)0x0;
            }
            else {
              pAVar16 = (ALfloat *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar32] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alListenerfv(&callerinfo,uVar2,pAVar15,uVar7,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x3a:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alListenerf(&callerinfo,uVar2,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 0x3b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alListener3f(&callerinfo,uVar2,AVar4,AVar5,AVar6);
            }
          }
          goto LAB_0010ca8f;
        case 0x3c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar19 = (ALint *)0x0;
            }
            else {
              pAVar19 = (ALint *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar8 = readle32();
              pAVar19[uVar32] = uVar8;
            }
            if (io_failure == '\0') {
              visit_alListeneriv(&callerinfo,uVar2,pAVar18,uVar7,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x3d:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alListeneri(&callerinfo,uVar2,uVar7);
            }
          }
          goto LAB_0010ca8f;
        case 0x3e:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            uVar8 = readle32();
            uVar10 = readle32();
            if (io_failure == '\0') {
              visit_alListener3i(&callerinfo,uVar2,uVar7,uVar8,uVar10);
            }
          }
          goto LAB_0010ca8f;
        case 0x3f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar16 = (ALfloat *)0x0;
            }
            else {
              pAVar16 = (ALfloat *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar32] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alGetListenerfv(&callerinfo,uVar2,pAVar15,uVar7,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x40:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar15 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetListenerf(&callerinfo,uVar2,pAVar15,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 0x41:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar15 = (ALfloat *)readle64();
            pAVar16 = (ALfloat *)readle64();
            pAVar17 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetListener3f(&callerinfo,uVar2,pAVar15,pAVar16,pAVar17,AVar4,AVar5,AVar6);
            }
          }
          goto LAB_0010ca8f;
        case 0x42:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alGetListeneri(&callerinfo,uVar2,pAVar18,uVar7);
            }
          }
          goto LAB_0010ca8f;
        case 0x43:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar7 = readle32();
            uVar34 = (ulong)uVar7;
            if (uVar7 == 0) {
              uVar34 = 0;
              pAVar19 = (ALint *)0x0;
            }
            else {
              pAVar19 = (ALint *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar8 = readle32();
              pAVar19[uVar32] = uVar8;
            }
            if (io_failure == '\0') {
              visit_alGetListeneriv(&callerinfo,uVar2,pAVar18,uVar7,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x44:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pAVar18 = (ALint *)readle64();
            pAVar19 = (ALint *)readle64();
            pAVar20 = (ALint *)readle64();
            uVar7 = readle32();
            uVar8 = readle32();
            uVar10 = readle32();
            if (io_failure == '\0') {
              visit_alGetListener3i(&callerinfo,uVar2,pAVar18,pAVar19,pAVar20,uVar7,uVar8,uVar10);
            }
          }
          goto LAB_0010ca8f;
        case 0x45:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alGenSources(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x46:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar32 = 0;
            uVar34 = 0;
            if (0 < iVar3) {
              uVar34 = uVar21 & 0xffffffff;
            }
            for (; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar2 = readle32();
              pAVar14[uVar32] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alDeleteSources(&callerinfo,iVar3,pAVar13,pAVar14);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              add_sourcelabel_to_map(pAVar14[uVar32],(char *)0x0);
            }
          }
          goto LAB_0010ca8f;
        case 0x47:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alIsSource(&callerinfo,(ALboolean)uVar7,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x48:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar8 = readle32();
            pAVar16 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
            for (uVar34 = 0; uVar8 != uVar34; uVar34 = uVar34 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar34] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alSourcefv(&callerinfo,uVar2,uVar7,pAVar15,uVar8,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x49:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alSourcef(&callerinfo,uVar2,uVar7,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 0x4a:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alSource3f(&callerinfo,uVar2,uVar7,AVar4,AVar5,AVar6);
            }
          }
          goto LAB_0010ca8f;
        case 0x4b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            pAVar19 = (ALint *)get_ioblob((ulong)uVar8 * 4);
            for (uVar34 = 0; uVar8 != uVar34; uVar34 = uVar34 + 1) {
              uVar10 = readle32();
              pAVar19[uVar34] = uVar10;
            }
            if (io_failure == '\0') {
              visit_alSourceiv(&callerinfo,uVar2,uVar7,pAVar18,uVar8,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x4c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            uVar8 = readle32();
            if (io_failure == '\0') {
              visit_alSourcei(&callerinfo,uVar2,uVar7,uVar8);
            }
          }
          goto LAB_0010ca8f;
        case 0x4d:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            uVar8 = readle32();
            uVar10 = readle32();
            uVar9 = readle32();
            if (io_failure == '\0') {
              visit_alSource3i(&callerinfo,uVar2,uVar7,uVar8,uVar10,uVar9);
            }
          }
          goto LAB_0010ca8f;
        case 0x4e:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar8 = readle32();
            uVar34 = (ulong)uVar8;
            if (uVar8 == 0) {
              uVar34 = 0;
              pAVar16 = (ALfloat *)0x0;
            }
            else {
              pAVar16 = (ALfloat *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar32] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alGetSourcefv(&callerinfo,uVar2,uVar7,pAVar15,uVar8,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x4f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetSourcef(&callerinfo,uVar2,uVar7,pAVar15,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 0x50:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            pAVar16 = (ALfloat *)readle64();
            pAVar17 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetSource3f(&callerinfo,uVar2,uVar7,pAVar15,pAVar16,pAVar17,AVar4,AVar5,AVar6)
              ;
            }
          }
          goto LAB_0010ca8f;
        case 0x51:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            uVar34 = (ulong)uVar8;
            if (uVar8 == 0) {
              uVar34 = 0;
              pAVar19 = (ALint *)0x0;
            }
            else {
              pAVar19 = (ALint *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar10 = readle32();
              pAVar19[uVar32] = uVar10;
            }
            if (io_failure == '\0') {
              visit_alGetSourceiv(&callerinfo,uVar2,uVar7,uVar7 == 0x1010,pAVar18,uVar8,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x52:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            if (io_failure == '\0') {
              visit_alGetSourcei(&callerinfo,uVar2,uVar7,uVar7 == 0x1010,pAVar18,uVar8);
            }
          }
          goto LAB_0010ca8f;
        case 0x53:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            pAVar19 = (ALint *)readle64();
            pAVar20 = (ALint *)readle64();
            uVar8 = readle32();
            uVar10 = readle32();
            uVar9 = readle32();
            if (io_failure == '\0') {
              visit_alGetSource3i(&callerinfo,uVar2,uVar7,pAVar18,pAVar19,pAVar20,uVar8,uVar10,uVar9
                                 );
            }
          }
          goto LAB_0010ca8f;
        case 0x54:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alSourcePlay(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x55:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alSourcePlayv(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x56:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alSourcePause(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x57:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alSourcePausev(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x58:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alSourceRewind(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x59:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alSourceRewindv(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x5a:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (uVar2 = readle32(), io_failure == '\0')) {
            visit_alSourceStop(&callerinfo,uVar2);
          }
          goto LAB_0010ca8f;
        case 0x5b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alSourceStopv(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x5c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar7 = readle32();
              pAVar14[uVar34] = uVar7;
            }
            if (io_failure == '\0') {
              visit_alSourceQueueBuffers(&callerinfo,uVar2,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x5d:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar7 = readle32();
              pAVar14[uVar34] = uVar7;
            }
            if (io_failure == '\0') {
              visit_alSourceUnqueueBuffers(&callerinfo,uVar2,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x5e:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar34 = 0;
            uVar32 = 0;
            if (0 < iVar3) {
              uVar32 = uVar21 & 0xffffffff;
            }
            for (; uVar32 != uVar34; uVar34 = uVar34 + 1) {
              uVar2 = readle32();
              pAVar14[uVar34] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alGenBuffers(&callerinfo,iVar3,pAVar13,pAVar14);
            }
          }
          goto LAB_0010ca8f;
        case 0x5f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar21 = readle64();
            pAVar13 = (ALuint *)readle64();
            iVar3 = (int)uVar21;
            pAVar14 = (ALuint *)get_ioblob((long)iVar3 * 4);
            uVar32 = 0;
            uVar34 = 0;
            if (0 < iVar3) {
              uVar34 = uVar21 & 0xffffffff;
            }
            for (; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar2 = readle32();
              pAVar14[uVar32] = uVar2;
            }
            if (io_failure == '\0') {
              visit_alDeleteBuffers(&callerinfo,iVar3,pAVar13,pAVar14);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              add_bufferlabel_to_map(pAVar14[uVar32],(char *)0x0);
            }
          }
          goto LAB_0010ca8f;
        case 0x60:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            if (io_failure == '\0') {
              visit_alIsBuffer(&callerinfo,(ALboolean)uVar7,uVar2);
            }
          }
          goto LAB_0010ca8f;
        case 0x61:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            bloblen = 0;
            uVar2 = readle32();
            uVar7 = readle32();
            uVar21 = readle64();
            origdata = (ALvoid *)readle64();
            puVar22 = IO_BLOB(&bloblen);
            if (io_failure == '\0') {
              visit_alBufferData(&callerinfo,uVar2,uVar7,origdata,puVar22,(ALsizei)bloblen,
                                 (ALsizei)uVar21);
            }
          }
          goto LAB_0010ca8f;
        case 0x62:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar8 = readle32();
            pAVar16 = (ALfloat *)get_ioblob((ulong)uVar8 * 4);
            for (uVar34 = 0; uVar8 != uVar34; uVar34 = uVar34 + 1) {
              uVar10 = readle32();
              pAVar16[uVar34] = (float)(int)uVar10;
            }
            if (io_failure == '\0') {
              visit_alBufferfv(&callerinfo,uVar2,uVar7,pAVar15,uVar8,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 99:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alBufferf(&callerinfo,uVar2,uVar7,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 100:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alBuffer3f(&callerinfo,uVar2,uVar7,AVar4,AVar5,AVar6);
            }
          }
          goto LAB_0010ca8f;
        case 0x65:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            pAVar19 = (ALint *)get_ioblob((ulong)uVar8 * 4);
            for (uVar34 = 0; uVar8 != uVar34; uVar34 = uVar34 + 1) {
              uVar10 = readle32();
              pAVar19[uVar34] = uVar10;
            }
            if (io_failure == '\0') {
              visit_alBufferiv(&callerinfo,uVar2,uVar7,pAVar18,uVar8,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x66:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            uVar8 = readle32();
            if (io_failure == '\0') {
              visit_alBufferi(&callerinfo,uVar2,uVar7,uVar8);
            }
          }
          goto LAB_0010ca8f;
        case 0x67:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            uVar8 = readle32();
            uVar10 = readle32();
            uVar9 = readle32();
            if (io_failure == '\0') {
              visit_alBuffer3i(&callerinfo,uVar2,uVar7,uVar8,uVar10,uVar9);
            }
          }
          goto LAB_0010ca8f;
        case 0x68:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            uVar8 = readle32();
            uVar34 = (ulong)uVar8;
            if (uVar8 == 0) {
              uVar34 = 0;
              pAVar16 = (ALfloat *)0x0;
            }
            else {
              pAVar16 = (ALfloat *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              AVar4 = (ALfloat)readle32();
              pAVar16[uVar32] = AVar4;
            }
            if (io_failure == '\0') {
              visit_alGetBufferfv(&callerinfo,uVar2,uVar7,pAVar15,uVar8,pAVar16);
            }
          }
          goto LAB_0010ca8f;
        case 0x69:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetBufferf(&callerinfo,uVar2,uVar7,pAVar15,AVar4);
            }
          }
          goto LAB_0010ca8f;
        case 0x6a:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar15 = (ALfloat *)readle64();
            pAVar16 = (ALfloat *)readle64();
            pAVar17 = (ALfloat *)readle64();
            AVar4 = (ALfloat)readle32();
            AVar5 = (ALfloat)readle32();
            AVar6 = (ALfloat)readle32();
            if (io_failure == '\0') {
              visit_alGetBuffer3f(&callerinfo,uVar2,uVar7,pAVar15,pAVar16,pAVar17,AVar4,AVar5,AVar6)
              ;
            }
          }
          goto LAB_0010ca8f;
        case 0x6b:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            if (io_failure == '\0') {
              visit_alGetBufferi(&callerinfo,uVar2,uVar7,pAVar18,uVar8);
            }
          }
          goto LAB_0010ca8f;
        case 0x6c:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            pAVar19 = (ALint *)readle64();
            pAVar20 = (ALint *)readle64();
            uVar8 = readle32();
            uVar10 = readle32();
            uVar9 = readle32();
            if (io_failure == '\0') {
              visit_alGetBuffer3i(&callerinfo,uVar2,uVar7,pAVar18,pAVar19,pAVar20,uVar8,uVar10,uVar9
                                 );
            }
          }
          goto LAB_0010ca8f;
        case 0x6d:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            uVar7 = readle32();
            pAVar18 = (ALint *)readle64();
            uVar8 = readle32();
            uVar34 = (ulong)uVar8;
            if (uVar8 == 0) {
              uVar34 = 0;
              pAVar19 = (ALint *)0x0;
            }
            else {
              pAVar19 = (ALint *)get_ioblob(uVar34 * 4);
            }
            for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
              uVar10 = readle32();
              pAVar19[uVar32] = uVar10;
            }
            if (io_failure == '\0') {
              visit_alGetBufferiv(&callerinfo,uVar2,uVar7,pAVar18,uVar8,pAVar19);
            }
          }
          goto LAB_0010ca8f;
        case 0x6e:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pcVar33 = IO_STRING();
            if (io_failure == '\0') {
              visit_alTracePushScope(&callerinfo,pcVar33);
            }
            trace_scope = trace_scope + 1;
          }
          goto LAB_0010ca8f;
        case 0x6f:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            callerinfo.trace_scope = callerinfo.trace_scope - 1;
            trace_scope = trace_scope - 1;
            visit_alTracePopScope(&callerinfo);
          }
          goto LAB_0010ca8f;
        case 0x70:
          IO_ENTRYINFO(&callerinfo);
          if ((io_failure == '\0') && (pcVar33 = IO_STRING(), io_failure == '\0')) {
            visit_alTraceMessage(&callerinfo,pcVar33);
          }
          goto LAB_0010ca8f;
        case 0x71:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pcVar33 = IO_STRING();
            if (uVar2 != 0) {
              if (pcVar33 == (char *)0x0) {
                pcVar31 = (char *)0x0;
              }
              else {
                pcVar31 = strdup(pcVar33);
                if (pcVar31 == (char *)0x0) goto LAB_0010f7ac;
              }
              add_bufferlabel_to_map(uVar2,pcVar31);
            }
LAB_0010f7ac:
            if (io_failure == '\0') {
              visit_alTraceBufferLabel(&callerinfo,uVar2,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x72:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            uVar2 = readle32();
            pcVar33 = IO_STRING();
            if (uVar2 != 0) {
              if (pcVar33 == (char *)0x0) {
                pcVar31 = (char *)0x0;
              }
              else {
                pcVar31 = strdup(pcVar33);
                if (pcVar31 == (char *)0x0) goto LAB_0010f782;
              }
              add_sourcelabel_to_map(uVar2,pcVar31);
            }
LAB_0010f782:
            if (io_failure == '\0') {
              visit_alTraceSourceLabel(&callerinfo,uVar2,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x73:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar29 = (ALCdevice *)readle64();
            pcVar33 = IO_STRING();
            if (pAVar29 != (ALCdevice *)0x0) {
              if (pcVar33 == (char *)0x0) {
                pcVar31 = (char *)0x0;
              }
              else {
                pcVar31 = strdup(pcVar33);
                if (pcVar31 == (char *)0x0) goto LAB_0010f803;
              }
              add_devicelabel_to_map(pAVar29,pcVar31);
            }
LAB_0010f803:
            if (io_failure == '\0') {
              visit_alcTraceDeviceLabel(&callerinfo,pAVar29,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        case 0x74:
          IO_ENTRYINFO(&callerinfo);
          if (io_failure == '\0') {
            pAVar23 = (ALCcontext *)readle64();
            pcVar33 = IO_STRING();
            if (pAVar23 != (ALCcontext *)0x0) {
              if (pcVar33 == (char *)0x0) {
                pcVar31 = (char *)0x0;
              }
              else {
                pcVar31 = strdup(pcVar33);
                if (pcVar31 == (char *)0x0) goto LAB_0010f7d7;
              }
              add_contextlabel_to_map(pAVar23,pcVar31);
            }
LAB_0010f7d7:
            if (io_failure == '\0') {
              visit_alcTraceContextLabel(&callerinfo,pAVar23,pcVar33);
            }
          }
          goto LAB_0010ca8f;
        }
        visit_eos(guserdata,okay,uVar2);
        bVar35 = false;
        goto LAB_0010ca91;
      }
      pcVar33 = "%s: File \'%s\' is an unsupported log file format version.\n";
    }
    else {
      pcVar33 = "%s: File \'%s\' does not appear to be an OpenAL log file.\n";
    }
    fprintf(_stderr,pcVar33,GAppName,fname);
  }
  quit_altrace_playback();
  return 0;
switchD_0010cb03_caseD_10:
  uVar2 = readle32();
  uVar7 = readle32();
  uVar8 = readle32();
  bVar35 = true;
  if (io_failure == '\0') goto LAB_0010f0df;
  goto LAB_0010ca91;
LAB_0010f0df:
  visit_buffer_state_changed_int(guserdata,uVar2,uVar7,uVar8);
  goto LAB_0010ca8f;
LAB_0010e7a1:
  bVar35 = uVar2 != 0;
  uVar2 = uVar2 - 1;
  if (bVar35) {
    pvVar24 = (void *)readle64();
    pcVar33 = IO_STRING();
    if (io_failure != '\0') goto LAB_0010ca8f;
    if ((pcVar33 != (char *)0x0) &&
       (pcVar33 = strdup(pcVar33), pcVar33 != (char *)0x0 && pvVar24 != (void *)0x0)) {
      add_stackframe_to_map(pvVar24,pcVar33);
    }
    goto LAB_0010e7a1;
  }
  goto LAB_0010ca8f;
}

Assistant:

int process_tracelog(const char *fname, void *userdata)
{
    int retval = 1;
    int eos = 0;
    off_t fdoffset = 0;
    off_t fdsize = 0;

    if (!init_altrace_playback(fname, userdata)) {
        return 0;
    }

    fdoffset = lseek(logfd, 0, SEEK_CUR);
    fdsize = lseek(logfd, 0, SEEK_END);
    if ((lseek(logfd, fdoffset, SEEK_SET) == -1) || (fdoffset == -1) || (fdsize == -1)) {
        fprintf(stderr, "%s: Failed to seek in file: %s\n", GAppName, strerror(errno));
        io_failure = 1;
    }

    while (!eos) {
        if (!io_failure) {
            fdoffset = lseek(logfd, 0, SEEK_CUR);
            if (fdoffset == -1) {
                fprintf(stderr, "%s: Failed to get current file offset: %s\n", GAppName, strerror(errno));
                io_failure = 1;
            }
        }

        if (io_failure) {
            retval = 0;
            eos = 1;
            break;
        }

        if (!visit_progress(guserdata, fdoffset, fdsize)) {
            fprintf(stderr, "%s: Application cancelled file processing!\n", GAppName);
            visit_eos(guserdata, AL_FALSE, 0);
            retval = -1;
            eos = 1;
            break;
        }

        switch (IO_EVENTENUM()) {
            #define ENTRYPOINT(ret,name,params,args,numargs,visitparams,visitargs) case ALEE_##name: decode_##name(); break;
            #include "altrace_entrypoints.h"

            case ALEE_NEW_CALLSTACK_SYMS:
                decode_callstack_syms_event();
                break;

            case ALEE_ALERROR_TRIGGERED:
                decode_al_error_event();
                break;

            case ALEE_ALCERROR_TRIGGERED:
                decode_alc_error_event();
                break;

            case ALEE_DEVICE_STATE_CHANGED_INT:
                decode_device_state_changed_int();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_ENUM:
                decode_context_state_changed_enum();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_FLOAT:
                decode_context_state_changed_float();
                break;

            case ALEE_CONTEXT_STATE_CHANGED_STRING:
                decode_context_state_changed_string();
                break;

            case ALEE_LISTENER_STATE_CHANGED_FLOATV:
                decode_listener_state_changed_floatv();
                break;

            case ALEE_SOURCE_STATE_CHANGED_BOOL:
                decode_source_state_changed_bool();
                break;

            case ALEE_SOURCE_STATE_CHANGED_ENUM:
                decode_source_state_changed_enum();
                break;

            case ALEE_SOURCE_STATE_CHANGED_INT:
                decode_source_state_changed_int();
                break;

            case ALEE_SOURCE_STATE_CHANGED_UINT:
                decode_source_state_changed_uint();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT:
                decode_source_state_changed_float();
                break;

            case ALEE_SOURCE_STATE_CHANGED_FLOAT3:
                decode_source_state_changed_float3();
                break;

            case ALEE_BUFFER_STATE_CHANGED_INT:
                decode_buffer_state_changed_int();
                break;

            case ALEE_EOS:
                decode_eos();
                eos = 1;
                break;

            default:
                if (!io_failure) {
                    visit_eos(guserdata, AL_FALSE, 0);
                }
                retval = 0;
                eos = 1;
                break;
        }
    }

    if (io_failure) {
        visit_eos(guserdata, AL_FALSE, 0);
    }

    quit_altrace_playback();

    return retval;
}